

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_message.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::cpp::MessageGenerator::GenerateMergeFrom
          (MessageGenerator *this,Printer *printer)

{
  FieldGeneratorMap *this_00;
  FieldDescriptor *pFVar1;
  MessageGenerator *pMVar2;
  int iVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  uint uVar7;
  pointer ppFVar8;
  LogMessage *pLVar9;
  FieldGenerator *pFVar10;
  long lVar11;
  Descriptor *pDVar12;
  ulong uVar13;
  uint uVar14;
  uint extraout_EDX;
  uint extraout_EDX_00;
  uint extraout_EDX_01;
  int extraout_EDX_02;
  int extraout_EDX_03;
  int extraout_EDX_04;
  pointer ppFVar15;
  protobuf *extraout_RDX;
  char *pcVar17;
  protobuf *this_01;
  undefined8 uVar18;
  _Alloc_hider _Var19;
  long *plVar20;
  int iVar21;
  ulong uVar23;
  int iVar24;
  FieldGeneratorMap *pFVar25;
  int iVar26;
  int iVar27;
  ulong uVar28;
  int new_index;
  int iVar29;
  ulong uVar30;
  int iVar31;
  long lVar32;
  bool bVar33;
  bool bVar34;
  Hex hex;
  string mask;
  uint local_ac;
  undefined1 local_a8 [56];
  MessageGenerator *local_70;
  int local_64;
  FieldGeneratorMap *local_60;
  int local_54;
  string local_50;
  protobuf *ppVar16;
  ulong uVar22;
  
  if (((this->options_).enforce_lite == false) &&
     (*(int *)(*(long *)(*(long *)(this->descriptor_ + 0x10) + 0xa0) + 0xa8) != 3)) {
    io::Printer::Print(printer,
                       "void $classname$::MergeFrom(const ::google::protobuf::Message& from) {\n// @@protoc_insertion_point(generalized_merge_from_start:$full_name$)\n  GOOGLE_DCHECK_NE(&from, this);\n"
                       ,"classname",&this->classname_,"full_name",
                       *(string **)(this->descriptor_ + 8));
    io::Printer::Indent(printer);
    io::Printer::Print(printer,
                       "const $classname$* source =\n    ::google::protobuf::internal::DynamicCastToGenerated<const $classname$>(\n        &from);\nif (source == NULL) {\n// @@protoc_insertion_point(generalized_merge_from_cast_fail:$full_name$)\n  ::google::protobuf::internal::ReflectionOps::Merge(from, this);\n} else {\n// @@protoc_insertion_point(generalized_merge_from_cast_success:$full_name$)\n  MergeFrom(*source);\n}\n"
                       ,"classname",&this->classname_,"full_name",
                       *(string **)(this->descriptor_ + 8));
    io::Printer::Outdent(printer);
    io::Printer::Print(printer,"}\n\n");
  }
  else {
    io::Printer::Print(printer,
                       "void $classname$::CheckTypeAndMergeFrom(\n    const ::google::protobuf::MessageLite& from) {\n  MergeFrom(*::google::protobuf::down_cast<const $classname$*>(&from));\n}\n\n"
                       ,"classname",&this->classname_);
  }
  io::Printer::Print(printer,
                     "void $classname$::MergeFrom(const $classname$& from) {\n// @@protoc_insertion_point(class_specific_merge_from_start:$full_name$)\n  GOOGLE_DCHECK_NE(&from, this);\n"
                     ,"classname",&this->classname_,"full_name",*(string **)(this->descriptor_ + 8))
  ;
  io::Printer::Indent(printer);
  if (0 < *(int *)(this->descriptor_ + 0x68)) {
    io::Printer::Print(printer,"_extensions_.MergeFrom(from._extensions_);\n");
  }
  io::Printer::Print(printer,
                     "_internal_metadata_.MergeFrom(from._internal_metadata_);\n::google::protobuf::uint32 cached_has_bits = 0;\n(void) cached_has_bits;\n\n"
                    );
  ppFVar8 = (this->optimized_order_).
            super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  ppFVar15 = (this->optimized_order_).
             super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  local_70 = this;
  if (ppFVar15 != ppFVar8) {
    local_60 = &this->field_generators_;
    iVar31 = 0;
    local_ac = 0xffffffff;
    iVar27 = -1;
    do {
      if (iVar31 == iVar27) {
        internal::LogMessage::LogMessage
                  ((LogMessage *)local_a8,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/compiler/cpp/cpp_message.cc"
                   ,0xbde);
        pLVar9 = internal::LogMessage::operator<<
                           ((LogMessage *)local_a8,"CHECK failed: (i) != (last_i): ");
        internal::LogFinisher::operator=((LogFinisher *)&local_50,pLVar9);
        internal::LogMessage::~LogMessage((LogMessage *)local_a8);
        ppFVar8 = (this->optimized_order_).
                  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        ppFVar15 = (this->optimized_order_).
                   super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
      }
      uVar30 = (ulong)iVar31;
      uVar13 = (long)ppFVar15 - (long)ppFVar8 >> 3;
      iVar29 = iVar31;
      if (uVar30 < uVar13) {
        do {
          if (*(int *)(ppFVar8[uVar30] + 0x4c) != 3) {
            uVar13 = (long)ppFVar15 - (long)ppFVar8 >> 3;
            break;
          }
          pFVar10 = FieldGeneratorMap::get(local_60,ppFVar8[uVar30]);
          (*pFVar10->_vptr_FieldGenerator[0xb])(pFVar10,printer);
          uVar30 = uVar30 + 1;
          ppFVar8 = (this->optimized_order_).
                    super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          ppFVar15 = (this->optimized_order_).
                     super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
          uVar13 = (long)ppFVar15 - (long)ppFVar8 >> 3;
        } while (uVar30 < uVar13);
        iVar29 = (int)uVar30;
        uVar30 = (ulong)iVar29;
      }
      iVar27 = iVar31;
      if (uVar30 < uVar13) {
        this_01 = (protobuf *)0x0;
        iVar24 = -1;
        uVar28 = 0xffffffff;
        uVar22 = 0xffffffff;
        do {
          iVar21 = (int)uVar22;
          iVar26 = (int)uVar28;
          uVar28 = uVar30 & 0xffffffff;
          iVar29 = (int)uVar30;
          pFVar1 = ppFVar8[uVar30];
          iVar3 = iVar29;
          if (*(int *)(pFVar1 + 0x4c) == 3) goto LAB_00259cec;
          uVar7 = 0;
          if (*(int *)(*(long *)(this->descriptor_ + 0x10) + 0x8c) != 3) {
            if (pFVar1[0x50] == (FieldDescriptor)0x0) {
              plVar20 = (long *)(*(long *)(pFVar1 + 0x58) + 0x30);
            }
            else if (*(long *)(pFVar1 + 0x68) == 0) {
              plVar20 = (long *)(*(long *)(pFVar1 + 0x30) + 0x98);
            }
            else {
              plVar20 = (long *)(*(long *)(pFVar1 + 0x68) + 0x80);
            }
            uVar7 = (this->has_bit_indices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start
                    [(int)((ulong)((long)pFVar1 - *plVar20) >> 3) * 0x3cf3cf3d];
          }
          uVar14 = uVar7 + 7;
          if (-1 < (int)uVar7) {
            uVar14 = uVar7;
          }
          uVar23 = uVar28;
          iVar3 = (int)uVar14 >> 3;
          if ((iVar24 != -1) && (uVar23 = uVar22, iVar3 = iVar24, (int)uVar14 >> 3 != iVar24))
          goto LAB_00259cf6;
          iVar24 = iVar3;
          iVar21 = (int)uVar23;
          this_01 = (protobuf *)(ulong)((uint)this_01 | 1 << (uVar7 & 0x1f));
          uVar30 = uVar30 + 1;
          uVar22 = uVar23;
        } while (uVar30 < uVar13);
        iVar3 = (int)uVar30;
        iVar26 = iVar29;
LAB_00259cec:
        iVar29 = iVar3;
        this = local_70;
        if (iVar24 != -1) {
LAB_00259cf6:
          local_64 = iVar29;
          if (iVar21 == -1) {
            internal::LogMessage::LogMessage
                      ((LogMessage *)local_a8,LOGLEVEL_DFATAL,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/compiler/cpp/cpp_message.cc"
                       ,0xc0b);
            pLVar9 = internal::LogMessage::operator<<
                               ((LogMessage *)local_a8,"CHECK failed: (-1) != (last_chunk_start): ")
            ;
            internal::LogFinisher::operator=((LogFinisher *)&local_50,pLVar9);
            internal::LogMessage::~LogMessage((LogMessage *)local_a8);
          }
          if (iVar26 == -1) {
            internal::LogMessage::LogMessage
                      ((LogMessage *)local_a8,LOGLEVEL_DFATAL,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/compiler/cpp/cpp_message.cc"
                       ,0xc0c);
            pLVar9 = internal::LogMessage::operator<<
                               ((LogMessage *)local_a8,"CHECK failed: (-1) != (last_chunk_end): ");
            internal::LogFinisher::operator=((LogFinisher *)&local_50,pLVar9);
            internal::LogMessage::~LogMessage((LogMessage *)local_a8);
          }
          if ((int)this_01 == 0) {
            internal::LogMessage::LogMessage
                      ((LogMessage *)local_a8,LOGLEVEL_DFATAL,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/compiler/cpp/cpp_message.cc"
                       ,0xc0d);
            pLVar9 = internal::LogMessage::operator<<
                               ((LogMessage *)local_a8,"CHECK failed: (0) != (last_chunk_mask): ");
            internal::LogFinisher::operator=((LogFinisher *)&local_50,pLVar9);
            internal::LogMessage::~LogMessage((LogMessage *)local_a8);
            uVar7 = 0;
            ppVar16 = extraout_RDX;
          }
          else {
            uVar7 = 0;
            ppVar16 = this_01;
            do {
              uVar14 = (uint)ppVar16;
              uVar7 = uVar7 + (uVar14 & 1);
              ppVar16 = (protobuf *)((ulong)ppVar16 >> 1);
            } while (1 < uVar14);
          }
          bVar33 = *(int *)(*(long *)(local_70->descriptor_ + 0x10) + 0x8c) != 3;
          bVar34 = iVar21 != iVar26;
          uVar14 = (uint)CONCAT71((int7)((ulong)ppVar16 >> 8),bVar34 && bVar33);
          if (bVar34 && bVar33) {
            if ((int)uVar7 < 2) {
              internal::LogMessage::LogMessage
                        ((LogMessage *)local_a8,LOGLEVEL_DFATAL,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/compiler/cpp/cpp_message.cc"
                         ,0xc17);
              pLVar9 = internal::LogMessage::operator<<
                                 ((LogMessage *)local_a8,"CHECK failed: (2) <= (count): ");
              internal::LogFinisher::operator=((LogFinisher *)&local_50,pLVar9);
LAB_00259ece:
              internal::LogMessage::~LogMessage((LogMessage *)local_a8);
              uVar14 = extraout_EDX;
            }
            else if (8 < uVar7) {
              internal::LogMessage::LogMessage
                        ((LogMessage *)local_a8,LOGLEVEL_DFATAL,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/compiler/cpp/cpp_message.cc"
                         ,0xc18);
              pLVar9 = internal::LogMessage::operator<<
                                 ((LogMessage *)local_a8,"CHECK failed: (8) >= (count): ");
              internal::LogFinisher::operator=((LogFinisher *)&local_50,pLVar9);
              goto LAB_00259ece;
            }
            iVar27 = iVar24 + 3;
            if (-1 < iVar24) {
              iVar27 = iVar24;
            }
            uVar7 = iVar27 >> 2;
            if (local_ac != uVar7) {
              SimpleItoa_abi_cxx11_((string *)local_a8,(protobuf *)(ulong)uVar7,uVar14);
              io::Printer::Print(printer,"cached_has_bits = from._has_bits_[$new_index$];\n",
                                 "new_index",(string *)local_a8);
              uVar14 = extraout_EDX_00;
              local_ac = uVar7;
              if ((undefined1 *)local_a8._0_8_ != local_a8 + 0x10) {
                operator_delete((void *)local_a8._0_8_,local_a8._16_8_ + 1);
                uVar14 = extraout_EDX_01;
              }
            }
            SimpleItoa_abi_cxx11_((string *)local_a8,this_01,uVar14);
            io::Printer::Print(printer,"if (cached_has_bits & $mask$u) {\n","mask",
                               (string *)local_a8);
            if ((undefined1 *)local_a8._0_8_ != local_a8 + 0x10) {
              operator_delete((void *)local_a8._0_8_,local_a8._16_8_ + 1);
            }
            io::Printer::Indent(printer);
            if (iVar21 <= iVar26) goto LAB_00259f8e;
          }
          else {
            this = local_70;
            iVar29 = local_64;
            if (iVar26 < iVar21) goto LAB_0025a27d;
LAB_00259f8e:
            lVar32 = (long)iVar21;
            iVar27 = (iVar26 - iVar21) + 1;
            bVar6 = false;
            local_54 = iVar31;
            do {
              pMVar2 = local_70;
              pFVar1 = (local_70->optimized_order_).
                       super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                       ._M_impl.super__Vector_impl_data._M_start[lVar32];
              pFVar10 = FieldGeneratorMap::get(local_60,pFVar1);
              if (*(int *)(*(long *)(pMVar2->descriptor_ + 0x10) + 0x8c) == 3) {
                local_a8._0_8_ = local_a8 + 0x10;
                std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,"from.","");
                bVar4 = anon_unknown_0::EmitFieldNonDefaultCondition
                                  (printer,(string *)local_a8,pFVar1);
                if ((undefined1 *)local_a8._0_8_ != local_a8 + 0x10) {
                  operator_delete((void *)local_a8._0_8_,local_a8._16_8_ + 1);
                }
              }
              else {
                if (pFVar1[0x50] == (FieldDescriptor)0x0) {
                  plVar20 = (long *)(*(long *)(pFVar1 + 0x58) + 0x30);
                }
                else if (*(long *)(pFVar1 + 0x68) == 0) {
                  plVar20 = (long *)(*(long *)(pFVar1 + 0x30) + 0x98);
                }
                else {
                  plVar20 = (long *)(*(long *)(pFVar1 + 0x68) + 0x80);
                }
                iVar31 = (local_70->has_bit_indices_).super__Vector_base<int,_std::allocator<int>_>.
                         _M_impl.super__Vector_impl_data._M_start
                         [(int)((ulong)((long)pFVar1 - *plVar20) >> 3) * 0x3cf3cf3d];
                iVar29 = iVar31 + 0x1f;
                if (-1 < iVar31) {
                  iVar29 = iVar31;
                }
                if (((*(FieldDescriptor **)(pFVar1 + 0x80))[0x6f] == (FieldDescriptor)0x0) &&
                   (local_ac == iVar29 >> 5)) {
                  hex.value = 1L << ((byte)iVar31 & 0x1f);
                  hex._8_8_ = 8;
                  strings::AlphaNum::AlphaNum((AlphaNum *)local_a8,hex);
                  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)&local_50,local_a8._0_8_,
                             (char *)(local_a8._8_8_ + local_a8._0_8_));
                  io::Printer::Print(printer,"if (cached_has_bits & 0x$mask$u) {\n","mask",&local_50
                                    );
                  uVar18 = local_50.field_2._M_allocated_capacity;
                  _Var19._M_p = local_50._M_dataplus._M_p;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_50._M_dataplus._M_p != &local_50.field_2) {
LAB_0025a13e:
                    operator_delete(_Var19._M_p,uVar18 + 1);
                  }
                }
                else {
                  FieldName_abi_cxx11_
                            ((string *)local_a8,(cpp *)pFVar1,*(FieldDescriptor **)(pFVar1 + 0x80));
                  io::Printer::Print(printer,"if (from.has_$name$()) {\n","name",(string *)local_a8)
                  ;
                  uVar18 = local_a8._16_8_;
                  _Var19._M_p = (pointer)local_a8._0_8_;
                  if ((undefined1 *)local_a8._0_8_ != local_a8 + 0x10) goto LAB_0025a13e;
                }
                io::Printer::Indent(printer);
                bVar4 = true;
              }
              if ((bVar34 && bVar33) && (bVar5 = anon_unknown_0::IsPOD(pFVar1), bVar5)) {
                bVar6 = true;
                lVar11 = 0x60;
              }
              else {
                lVar11 = 0x58;
              }
              (**(code **)((long)pFVar10->_vptr_FieldGenerator + lVar11))(pFVar10,printer);
              iVar24 = extraout_EDX_02;
              if (bVar4 != false) {
                io::Printer::Outdent(printer);
                io::Printer::Print(printer,"}\n");
                iVar24 = extraout_EDX_03;
              }
              iVar31 = local_54;
              lVar32 = lVar32 + 1;
              iVar27 = iVar27 + -1;
            } while (iVar27 != 0);
            this = local_70;
            iVar27 = local_54;
            iVar29 = local_64;
            if (!bVar34 || !bVar33) goto LAB_0025a27d;
            if (bVar6) {
              if ((int)local_ac < 0) {
                internal::LogMessage::LogMessage
                          ((LogMessage *)local_a8,LOGLEVEL_DFATAL,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/compiler/cpp/cpp_message.cc"
                           ,0xc5d);
                pLVar9 = internal::LogMessage::operator<<
                                   ((LogMessage *)local_a8,
                                    "CHECK failed: (0) <= (cached_has_bit_index): ");
                internal::LogFinisher::operator=((LogFinisher *)&local_50,pLVar9);
                internal::LogMessage::~LogMessage((LogMessage *)local_a8);
                iVar24 = extraout_EDX_04;
              }
              SimpleItoa_abi_cxx11_((string *)local_a8,(protobuf *)(ulong)local_ac,iVar24);
              io::Printer::Print(printer,"_has_bits_[$index$] |= cached_has_bits;\n","index",
                                 (string *)local_a8);
              if ((undefined1 *)local_a8._0_8_ != local_a8 + 0x10) {
                operator_delete((void *)local_a8._0_8_,local_a8._16_8_ + 1);
              }
            }
          }
          io::Printer::Outdent(printer);
          io::Printer::Print(printer,"}\n");
          this = local_70;
          iVar27 = iVar31;
          iVar29 = local_64;
        }
      }
LAB_0025a27d:
      iVar31 = iVar29;
      ppFVar8 = (this->optimized_order_).
                super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      ppFVar15 = (this->optimized_order_).
                 super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
    } while ((ulong)(long)iVar31 < (ulong)((long)ppFVar15 - (long)ppFVar8 >> 3));
  }
  pDVar12 = this->descriptor_;
  if (0 < *(int *)(pDVar12 + 0x38)) {
    this_00 = &this->field_generators_;
    pFVar25 = (FieldGeneratorMap *)0x0;
    do {
      io::Printer::Print(printer,"switch (from.$oneofname$_case()) {\n","oneofname",
                         *(string **)(*(long *)(pDVar12 + 0x40) + (long)pFVar25 * 0x30));
      io::Printer::Indent(printer);
      lVar32 = *(long *)(this->descriptor_ + 0x40);
      local_60 = pFVar25;
      if (0 < *(int *)(lVar32 + 0x1c + (long)pFVar25 * 0x30)) {
        lVar11 = 0;
        do {
          pFVar1 = *(FieldDescriptor **)
                    (*(long *)(lVar32 + 0x20 + (long)pFVar25 * 0x30) + lVar11 * 8);
          UnderscoresToCamelCase((string *)local_a8,*(string **)pFVar1,true);
          io::Printer::Print(printer,"case k$field_name$: {\n","field_name",(string *)local_a8);
          if ((undefined1 *)local_a8._0_8_ != local_a8 + 0x10) {
            operator_delete((void *)local_a8._0_8_,local_a8._16_8_ + 1);
          }
          io::Printer::Indent(printer);
          pFVar10 = FieldGeneratorMap::get(this_00,pFVar1);
          (*pFVar10->_vptr_FieldGenerator[0xb])(pFVar10,printer);
          io::Printer::Print(printer,"break;\n");
          io::Printer::Outdent(printer);
          io::Printer::Print(printer,"}\n");
          lVar11 = lVar11 + 1;
          lVar32 = *(long *)(local_70->descriptor_ + 0x40);
          this = local_70;
        } while (lVar11 < *(int *)(lVar32 + 0x1c + (long)pFVar25 * 0x30));
      }
      plVar20 = *(long **)(lVar32 + (long)pFVar25 * 0x30);
      local_a8._0_8_ = local_a8 + 0x10;
      lVar32 = *plVar20;
      std::__cxx11::string::_M_construct<char*>((string *)local_a8,lVar32,plVar20[1] + lVar32);
      if ((char *)local_a8._8_8_ != (char *)0x0) {
        pcVar17 = (char *)0x0;
        do {
          if ((byte)(*(char *)(local_a8._0_8_ + (long)pcVar17) + 0x9fU) < 0x1a) {
            *(char *)(local_a8._0_8_ + (long)pcVar17) =
                 *(char *)(local_a8._0_8_ + (long)pcVar17) + -0x20;
          }
          pcVar17 = pcVar17 + 1;
        } while ((char *)local_a8._8_8_ != pcVar17);
      }
      io::Printer::Print(printer,"case $cap_oneof_name$_NOT_SET: {\n  break;\n}\n","cap_oneof_name",
                         (string *)local_a8);
      pFVar25 = local_60;
      if ((undefined1 *)local_a8._0_8_ != local_a8 + 0x10) {
        operator_delete((void *)local_a8._0_8_,local_a8._16_8_ + 1);
      }
      io::Printer::Outdent(printer);
      io::Printer::Print(printer,"}\n");
      pFVar25 = (FieldGeneratorMap *)((long)&pFVar25->descriptor_ + 1);
      pDVar12 = this->descriptor_;
    } while ((long)pFVar25 < (long)*(int *)(pDVar12 + 0x38));
  }
  if (this->num_weak_fields_ != 0) {
    io::Printer::Print(printer,"_weak_field_map_.MergeFrom(from._weak_field_map_);\n");
  }
  io::Printer::Outdent(printer);
  io::Printer::Print(printer,"}\n");
  return;
}

Assistant:

void MessageGenerator::
GenerateMergeFrom(io::Printer* printer) {
  if (HasDescriptorMethods(descriptor_->file(), options_)) {
    // Generate the generalized MergeFrom (aka that which takes in the Message
    // base class as a parameter).
    printer->Print(
        "void $classname$::MergeFrom(const ::google::protobuf::Message& from) {\n"
        "// @@protoc_insertion_point(generalized_merge_from_start:"
        "$full_name$)\n"
        "  GOOGLE_DCHECK_NE(&from, this);\n",
        "classname", classname_, "full_name", descriptor_->full_name());
    printer->Indent();

    // Cast the message to the proper type. If we find that the message is
    // *not* of the proper type, we can still call Merge via the reflection
    // system, as the GOOGLE_CHECK above ensured that we have the same descriptor
    // for each message.
    printer->Print(
      "const $classname$* source =\n"
      "    ::google::protobuf::internal::DynamicCastToGenerated<const $classname$>(\n"
      "        &from);\n"
      "if (source == NULL) {\n"
      "// @@protoc_insertion_point(generalized_merge_from_cast_fail:"
      "$full_name$)\n"
      "  ::google::protobuf::internal::ReflectionOps::Merge(from, this);\n"
      "} else {\n"
      "// @@protoc_insertion_point(generalized_merge_from_cast_success:"
      "$full_name$)\n"
      "  MergeFrom(*source);\n"
      "}\n",
      "classname", classname_, "full_name", descriptor_->full_name());

    printer->Outdent();
    printer->Print("}\n\n");
  } else {
    // Generate CheckTypeAndMergeFrom().
    printer->Print(
      "void $classname$::CheckTypeAndMergeFrom(\n"
      "    const ::google::protobuf::MessageLite& from) {\n"
      "  MergeFrom(*::google::protobuf::down_cast<const $classname$*>(&from));\n"
      "}\n"
      "\n",
      "classname", classname_);
  }

  // Generate the class-specific MergeFrom, which avoids the GOOGLE_CHECK and cast.
  printer->Print(
      "void $classname$::MergeFrom(const $classname$& from) {\n"
      "// @@protoc_insertion_point(class_specific_merge_from_start:"
      "$full_name$)\n"
      "  GOOGLE_DCHECK_NE(&from, this);\n",
      "classname", classname_, "full_name", descriptor_->full_name());
  printer->Indent();

  if (descriptor_->extension_range_count() > 0) {
    printer->Print("_extensions_.MergeFrom(from._extensions_);\n");
  }

  printer->Print(
    "_internal_metadata_.MergeFrom(from._internal_metadata_);\n"
    "::google::protobuf::uint32 cached_has_bits = 0;\n"
    "(void) cached_has_bits;\n\n");

  // cached_has_bit_index maintains that:
  //   cached_has_bits = from._has_bits_[cached_has_bit_index]
  // for cached_has_bit_index >= 0
  int cached_has_bit_index = -1;

  int last_i = -1;
  for (int i = 0; i < optimized_order_.size(); ) {
    // Detect infinite loops.
    GOOGLE_CHECK_NE(i, last_i);
    last_i = i;

    // Merge Repeated fields. These fields do not require a
    // check as we can simply iterate over them.
    for (; i < optimized_order_.size(); i++) {
      const FieldDescriptor* field = optimized_order_[i];
      if (!field->is_repeated()) {
        break;
      }

      const FieldGenerator& generator = field_generators_.get(field);
      generator.GenerateMergingCode(printer);
    }

    // Merge Optional and Required fields (after a _has_bit_ check).
    int last_chunk = -1;
    int last_chunk_start = -1;
    int last_chunk_end = -1;
    uint32 last_chunk_mask = 0;
    for (; i < optimized_order_.size(); i++) {
      const FieldDescriptor* field = optimized_order_[i];
      if (field->is_repeated()) {
        break;
      }

      // "index" defines where in the _has_bits_ the field appears.
      // "i" is our loop counter within optimized_order_.
      int index = HasFieldPresence(descriptor_->file()) ?
          has_bit_indices_[field->index()] : 0;
      int chunk = index / 8;

      if (last_chunk == -1) {
        last_chunk = chunk;
        last_chunk_start = i;
      } else if (chunk != last_chunk) {
        // Emit the fields for this chunk so far.
        break;
      }

      last_chunk_end = i;
      last_chunk_mask |= static_cast<uint32>(1) << (index % 32);
    }

    if (last_chunk != -1) {
      GOOGLE_DCHECK_NE(-1, last_chunk_start);
      GOOGLE_DCHECK_NE(-1, last_chunk_end);
      GOOGLE_DCHECK_NE(0, last_chunk_mask);

      const int count = popcnt(last_chunk_mask);
      const bool have_outer_if = HasFieldPresence(descriptor_->file()) &&
          (last_chunk_start != last_chunk_end);

      if (have_outer_if) {
        // Check (up to) 8 has_bits at a time if we have more than one field in
        // this chunk.  Due to field layout ordering, we may check
        // _has_bits_[last_chunk * 8 / 32] multiple times.
        GOOGLE_DCHECK_LE(2, count);
        GOOGLE_DCHECK_GE(8, count);

        if (cached_has_bit_index != last_chunk / 4) {
          int new_index = last_chunk / 4;
          printer->Print("cached_has_bits = from._has_bits_[$new_index$];\n",
                         "new_index", SimpleItoa(new_index));
          cached_has_bit_index = new_index;
        }

        printer->Print(
          "if (cached_has_bits & $mask$u) {\n",
          "mask", SimpleItoa(last_chunk_mask));
        printer->Indent();
      }

      // Go back and emit clears for each of the fields we processed.
      bool deferred_has_bit_changes = false;
      for (int j = last_chunk_start; j <= last_chunk_end; j++) {
        const FieldDescriptor* field = optimized_order_[j];
        const FieldGenerator& generator = field_generators_.get(field);

        bool have_enclosing_if = false;
        if (HasFieldPresence(descriptor_->file())) {
          // Attempt to use the state of cached_has_bits, if possible.
          int has_bit_index = has_bit_indices_[field->index()];
          if (!field->options().weak() &&
              cached_has_bit_index == has_bit_index / 32) {
            const string mask = StrCat(
                strings::Hex(1u << (has_bit_index % 32),
                strings::ZERO_PAD_8));

            printer->Print(
                "if (cached_has_bits & 0x$mask$u) {\n", "mask", mask);
          } else {
            printer->Print(
              "if (from.has_$name$()) {\n",
              "name", FieldName(field));
          }

          printer->Indent();
          have_enclosing_if = true;
        } else {
          // Merge semantics without true field presence: primitive fields are
          // merged only if non-zero (numeric) or non-empty (string).
          have_enclosing_if = EmitFieldNonDefaultCondition(
              printer, "from.", field);
        }

        if (have_outer_if && IsPOD(field)) {
          // GenerateCopyConstructorCode for enum and primitive scalar fields
          // does not do _has_bits_ modifications.  We defer _has_bits_
          // manipulation until the end of the outer if.
          //
          // This can reduce the number of loads/stores by up to 7 per 8 fields.
          deferred_has_bit_changes = true;
          generator.GenerateCopyConstructorCode(printer);
        } else {
          generator.GenerateMergingCode(printer);
        }

        if (have_enclosing_if) {
          printer->Outdent();
          printer->Print("}\n");
        }
      }

      if (have_outer_if) {
        if (deferred_has_bit_changes) {
          // Flush the has bits for the primitives we deferred.
          GOOGLE_CHECK_LE(0, cached_has_bit_index);
          printer->Print(
              "_has_bits_[$index$] |= cached_has_bits;\n",
              "index", SimpleItoa(cached_has_bit_index));
        }

        printer->Outdent();
        printer->Print("}\n");
      }
    }
  }

  // Merge oneof fields. Oneof field requires oneof case check.
  for (int i = 0; i < descriptor_->oneof_decl_count(); ++i) {
    printer->Print(
        "switch (from.$oneofname$_case()) {\n",
        "oneofname", descriptor_->oneof_decl(i)->name());
    printer->Indent();
    for (int j = 0; j < descriptor_->oneof_decl(i)->field_count(); j++) {
      const FieldDescriptor* field = descriptor_->oneof_decl(i)->field(j);
      printer->Print(
          "case k$field_name$: {\n",
          "field_name", UnderscoresToCamelCase(field->name(), true));
      printer->Indent();
      field_generators_.get(field).GenerateMergingCode(printer);
      printer->Print(
          "break;\n");
      printer->Outdent();
      printer->Print(
          "}\n");
    }
    printer->Print(
        "case $cap_oneof_name$_NOT_SET: {\n"
        "  break;\n"
        "}\n",
        "cap_oneof_name",
        ToUpper(descriptor_->oneof_decl(i)->name()));
    printer->Outdent();
    printer->Print(
        "}\n");
  }
  if (num_weak_fields_) {
    printer->Print("_weak_field_map_.MergeFrom(from._weak_field_map_);\n");
  }

  printer->Outdent();
  printer->Print("}\n");
}